

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

rcode __thiscall
olc::PixelGameEngine::Construct
          (PixelGameEngine *this,int32_t screen_w,int32_t screen_h,int32_t pixel_w,int32_t pixel_h,
          bool full_screen,bool vsync,bool cohesion)

{
  int iVar1;
  int iVar2;
  vi2d vVar3;
  vi2d vVar4;
  vi2d vVar5;
  
  this->bPixelCohesion = cohesion;
  vVar5.y = screen_h;
  vVar5.x = screen_w;
  this->vScreenSize = vVar5;
  (this->vInvScreenSize).x = 1.0 / (float)screen_w;
  (this->vInvScreenSize).y = 1.0 / (float)screen_h;
  vVar3.y = pixel_h;
  vVar3.x = pixel_w;
  this->vPixelSize = vVar3;
  vVar4.x = pixel_w * screen_w;
  iVar1 = (this->vPixelSize).y;
  iVar2 = (this->vScreenSize).y;
  vVar4.y = iVar1 * iVar2;
  this->vWindowSize = vVar4;
  this->bFullScreen = full_screen;
  this->bEnableVSYNC = vsync;
  (this->vPixel).x = (float)(int)(2.0 / (float)screen_w);
  (this->vPixel).y = (float)(int)(2.0 / (float)iVar2);
  return (rcode)(0 < iVar2 && ((0 < screen_w && 0 < pixel_w) && 0 < iVar1));
}

Assistant:

olc::rcode PixelGameEngine::Construct(int32_t screen_w, int32_t screen_h, int32_t pixel_w, int32_t pixel_h, bool full_screen, bool vsync, bool cohesion)
	{
		bPixelCohesion = cohesion;
		vScreenSize = { screen_w, screen_h };
		vInvScreenSize = { 1.0f / float(screen_w), 1.0f / float(screen_h) };
		vPixelSize = { pixel_w, pixel_h };
		vWindowSize = vScreenSize * vPixelSize;
		bFullScreen = full_screen;
		bEnableVSYNC = vsync;
		vPixel = 2.0f / vScreenSize;

		if (vPixelSize.x <= 0 || vPixelSize.y <= 0 || vScreenSize.x <= 0 || vScreenSize.y <= 0)
			return olc::FAIL;
		return olc::OK;
	}